

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_do(Curl_easy *data,_Bool *done)

{
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  *done = false;
  data_local._4_4_ = mqtt_connect(data);
  if (data_local._4_4_ == CURLE_OK) {
    mqstate(data,MQTT_FIRST,MQTT_CONNACK);
    data_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_failf(data,"Error %d sending MQTT CONNECT request",(ulong)data_local._4_4_);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode mqtt_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  *done = FALSE; /* unconditionally */

  result = mqtt_connect(data);
  if(result) {
    failf(data, "Error %d sending MQTT CONNECT request", result);
    return result;
  }
  mqstate(data, MQTT_FIRST, MQTT_CONNACK);
  return CURLE_OK;
}